

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O0

Equality __thiscall capnp::AnyList::Reader::equals(Reader *this,Reader right)

{
  byte bVar1;
  Reader right_00;
  ulong uVar2;
  ElementSize EVar3;
  ElementSize EVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  Equality EVar8;
  byte *pbVar9;
  Reader local_168;
  Reader local_138;
  ulong local_108;
  size_t i;
  ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> rlist;
  ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> llist;
  ArrayPtr<const_unsigned_char> local_90;
  ArrayPtr<const_unsigned_char> local_80;
  ArrayPtr<const_unsigned_char> local_70;
  ArrayPtr<const_unsigned_char> local_60;
  ArrayPtr<const_unsigned_char> local_50;
  byte local_39;
  undefined1 auStack_38 [7];
  uint8_t mask;
  size_t local_28;
  size_t cmpSize;
  Reader *pRStack_18;
  Equality eqResult;
  Reader *this_local;
  
  pRStack_18 = this;
  uVar6 = size(this);
  uVar7 = size(&right);
  if (uVar6 == uVar7) {
    EVar3 = getElementSize(this);
    EVar4 = getElementSize(&right);
    if (EVar3 == EVar4) {
      cmpSize._4_4_ = EQUAL;
      EVar3 = getElementSize(this);
      if (EVar3 < POINTER) {
        _auStack_38 = getRawBytes(this);
        local_28 = kj::ArrayPtr<const_unsigned_char>::size
                             ((ArrayPtr<const_unsigned_char> *)auStack_38);
        EVar3 = getElementSize(this);
        if ((EVar3 == BIT) && (uVar6 = size(this), (uVar6 & 7) != 0)) {
          uVar6 = size(this);
          local_39 = (char)(1 << ((byte)uVar6 & 7)) - 1;
          local_50 = getRawBytes(this);
          pbVar9 = kj::ArrayPtr<const_unsigned_char>::operator[](&local_50,local_28 - 1);
          bVar1 = *pbVar9 & local_39;
          local_60 = getRawBytes(&right);
          pbVar9 = kj::ArrayPtr<const_unsigned_char>::operator[](&local_60,local_28 - 1);
          if (bVar1 != (*pbVar9 & local_39)) {
            return NOT_EQUAL;
          }
          local_28 = local_28 - 1;
        }
        local_80 = getRawBytes(this);
        local_70 = kj::ArrayPtr<const_unsigned_char>::first(&local_80,local_28);
        join_0x00000010_0x00000000_ = getRawBytes(&right);
        local_90 = kj::ArrayPtr<const_unsigned_char>::first
                             ((ArrayPtr<const_unsigned_char> *)&llist.reader.nestingLimit,local_28);
        bVar5 = kj::ArrayPtr<const_unsigned_char>::operator==(&local_70,&local_90);
        if (bVar5) {
          this_local._4_4_ = EQUAL;
        }
        else {
          this_local._4_4_ = NOT_EQUAL;
        }
      }
      else {
        if (1 < (byte)(EVar3 - POINTER)) {
          kj::_::unreachable();
        }
        as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                  ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&rlist.reader.nestingLimit,
                   this);
        as<capnp::List<capnp::AnyStruct,(capnp::Kind)7>>
                  ((ReaderFor<capnp::List<AnyStruct,_Kind::OTHER>_> *)&i,&right);
        for (local_108 = 0; uVar2 = local_108, uVar6 = size(this), uVar2 < uVar6;
            local_108 = local_108 + 1) {
          List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[]
                    (&local_138,(Reader *)&rlist.reader.nestingLimit,(uint)local_108);
          List<capnp::AnyStruct,_(capnp::Kind)7>::Reader::operator[]
                    (&local_168,(Reader *)&i,(uint)local_108);
          right_00._reader.capTable = local_168._reader.capTable;
          right_00._reader.segment = local_168._reader.segment;
          right_00._reader.data = local_168._reader.data;
          right_00._reader.pointers = local_168._reader.pointers;
          right_00._reader.dataSize = local_168._reader.dataSize;
          right_00._reader.pointerCount = local_168._reader.pointerCount;
          right_00._reader._38_2_ = local_168._reader._38_2_;
          right_00._reader.nestingLimit = local_168._reader.nestingLimit;
          right_00._reader._44_4_ = local_168._reader._44_4_;
          EVar8 = AnyStruct::Reader::equals(&local_138,right_00);
          if (EVar8 == NOT_EQUAL) {
            return NOT_EQUAL;
          }
          if (EVar8 != EQUAL) {
            if (EVar8 != UNKNOWN_CONTAINS_CAPS) {
              kj::_::unreachable();
            }
            cmpSize._4_4_ = UNKNOWN_CONTAINS_CAPS;
          }
        }
        this_local._4_4_ = cmpSize._4_4_;
      }
    }
    else {
      this_local._4_4_ = NOT_EQUAL;
    }
  }
  else {
    this_local._4_4_ = NOT_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

Equality AnyList::Reader::equals(AnyList::Reader right) const {
  if(size() != right.size()) {
    return Equality::NOT_EQUAL;
  }

  if (getElementSize() != right.getElementSize()) {
    return Equality::NOT_EQUAL;
  }

  auto eqResult = Equality::EQUAL;
  switch(getElementSize()) {
    case ElementSize::VOID:
    case ElementSize::BIT:
    case ElementSize::BYTE:
    case ElementSize::TWO_BYTES:
    case ElementSize::FOUR_BYTES:
    case ElementSize::EIGHT_BYTES: {
      size_t cmpSize = getRawBytes().size();

      if (getElementSize() == ElementSize::BIT && size() % 8 != 0) {
        // The list does not end on a byte boundary. We need special handling for the final
        // byte because we only care about the bits that are actually elements of the list.

        uint8_t mask = (1 << (size() % 8)) - 1; // lowest size() bits set
        if ((getRawBytes()[cmpSize - 1] & mask) != (right.getRawBytes()[cmpSize - 1] & mask)) {
          return Equality::NOT_EQUAL;
        }
        cmpSize -= 1;
      }

      if (getRawBytes().first(cmpSize) == right.getRawBytes().first(cmpSize)) {
        return Equality::EQUAL;
      } else {
        return Equality::NOT_EQUAL;
      }
    }
    case ElementSize::POINTER:
    case ElementSize::INLINE_COMPOSITE: {
      auto llist = as<List<AnyStruct>>();
      auto rlist = right.as<List<AnyStruct>>();
      for(size_t i = 0; i < size(); i++) {
        switch(llist[i].equals(rlist[i])) {
          case Equality::EQUAL:
            break;
          case Equality::NOT_EQUAL:
            return Equality::NOT_EQUAL;
          case Equality::UNKNOWN_CONTAINS_CAPS:
            eqResult = Equality::UNKNOWN_CONTAINS_CAPS;
            break;
          default:
            KJ_UNREACHABLE;
        }
      }
      return eqResult;
    }
  }
  KJ_UNREACHABLE;
}